

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splaygetbest(timeval i,Curl_tree *t,Curl_tree **removed)

{
  long lVar1;
  __suseconds_t _Var2;
  Curl_tree *pCVar3;
  Curl_tree *pCVar4;
  Curl_tree *pCVar5;
  
  if (t == (Curl_tree *)0x0) {
    pCVar5 = (Curl_tree *)0x0;
    pCVar4 = (Curl_tree *)0x0;
  }
  else {
    pCVar3 = Curl_splay((timeval)ZEXT816(0),t);
    lVar1 = (pCVar3->key).tv_sec;
    pCVar4 = pCVar3;
    pCVar5 = (Curl_tree *)0x0;
    if (lVar1 <= i.tv_sec) {
      if ((lVar1 < i.tv_sec) || ((pCVar3->key).tv_usec <= i.tv_usec)) {
        pCVar4 = pCVar3->samen;
        pCVar5 = pCVar3;
        if (pCVar4 == pCVar3) {
          pCVar4 = pCVar3->larger;
        }
        else {
          _Var2 = (pCVar3->key).tv_usec;
          (pCVar4->key).tv_sec = (pCVar3->key).tv_sec;
          (pCVar4->key).tv_usec = _Var2;
          pCVar4->larger = pCVar3->larger;
          pCVar4->smaller = pCVar3->smaller;
          pCVar4->samep = pCVar3->samep;
          pCVar3->samep->samen = pCVar4;
        }
      }
      else {
        pCVar5 = (Curl_tree *)0x0;
      }
    }
  }
  *removed = pCVar5;
  return pCVar4;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct timeval i,
                                       struct Curl_tree *t,
                                       struct Curl_tree **removed)
{
  static struct timeval tv_zero = {0, 0};
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  /* find smallest */
  t = Curl_splay(tv_zero, t);
  if(compare(i, t->key) < 0) {
    /* even the smallest is too big */
    *removed = NULL;
    return t;
  }

  /* FIRST! Check if there is a list with identical keys */
  x = t->samen;
  if(x != t) {
    /* there is, pick one from the list */

    /* 'x' is the new root node */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;

    *removed = t;
    return x; /* new root */
  }

  /* we splayed the tree to the smallest element, there is no smaller */
  x = t->larger;
  *removed = t;

  return x;
}